

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::DescriptorSet::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  deUint32 dVar1;
  Handle<(vk::HandleType)21> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  long lVar6;
  Parameters *pPVar7;
  Parameters *params_00;
  deUint32 type;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> typeCounts;
  deUint32 countByType [11];
  _Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_c8;
  Parameters *local_b0;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_a8;
  VkDescriptorPoolSize local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  undefined4 local_50;
  deUint32 local_4c;
  _Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_48;
  
  dVar1 = env->maxResourceConsumers;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar6 = 0; lVar6 != 0x2c; lVar6 = lVar6 + 4) {
    *(undefined4 *)((long)&local_88.type + lVar6) = 0;
  }
  params_00 = (Parameters *)
              (params->descriptorSetLayout).bindings.
              super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar7 = (Parameters *)
                (params->descriptorSetLayout).bindings.
                super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar7 != params_00;
      pPVar7 = (Parameters *)
               ((long)&(pPVar7->poolSizes).
                       super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4)) {
    (&local_88.type)[pPVar7->maxSets] =
         (&local_88.type)[pPVar7->maxSets] +
         *(int *)&(pPVar7->poolSizes).
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_start * dVar1;
  }
  lVar6 = 0;
  local_b0 = &params->descriptorSetLayout;
  for (; lVar6 != 0xb; lVar6 = lVar6 + 1) {
    if ((&local_88.type)[lVar6] != VK_DESCRIPTOR_TYPE_SAMPLER) {
      local_a8.m_data.object.m_internal = ((ulong)(&local_88.type)[lVar6] << 0x20) + lVar6;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      emplace_back<vk::VkDescriptorPoolSize>
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 &local_c8,(VkDescriptorPoolSize *)&local_a8);
    }
  }
  local_50 = 1;
  local_4c = dVar1;
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
             &local_48,
             (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
             &local_c8);
  DescriptorPool::create
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_a8,env,(Resources *)&local_50,params_00
            );
  pVVar5 = local_a8.m_data.deleter.m_allocator;
  pVVar4 = local_a8.m_data.deleter.m_device;
  pDVar3 = local_a8.m_data.deleter.m_deviceIface;
  HVar2.m_internal = local_a8.m_data.object.m_internal;
  local_78 = local_a8.m_data.deleter.m_device;
  pVStack_70 = local_a8.m_data.deleter.m_allocator;
  local_88.type = (undefined4)local_a8.m_data.object.m_internal;
  local_88.descriptorCount = local_a8.m_data.object.m_internal._4_4_;
  pDStack_80 = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_a8.m_data.object.m_internal._4_4_ = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_device = pVVar4;
  (this->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_allocator = pVVar5;
  (this->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
  m_internal = HVar2.m_internal;
  (this->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = pDVar3;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_a8);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base(&local_48);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base(&local_c8);
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
            (&this->descriptorSetLayout,env,local_b0);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: descriptorPool		(env, DescriptorPool::Parameters(VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, env.maxResourceConsumers, computePoolSizes(params.descriptorSetLayout, env.maxResourceConsumers)))
			, descriptorSetLayout	(env, params.descriptorSetLayout)
		{
		}